

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O3

hugeint_t __thiscall
duckdb::Interpolator<false>::
Operation<unsigned_long,duckdb::hugeint_t,duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>
          (Interpolator<false> *this,unsigned_long *v_t,Vector *result,
          QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
          *accessor)

{
  idx_t iVar1;
  long lVar2;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>_>
  __comp;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>_>
  __comp_00;
  _Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>_>_>
  __comp_01;
  bool bVar3;
  ulong uVar4;
  idx_t iVar5;
  InvalidInputException *pIVar6;
  int64_t iVar7;
  idx_t iVar8;
  idx_t iVar9;
  hugeint_t input;
  hugeint_t input_00;
  hugeint_t input_01;
  RESULT_TYPE RVar10;
  hugeint_t hVar11;
  hugeint_t result_1;
  string local_78;
  hugeint_t local_58;
  hugeint_t local_48;
  
  bVar3 = this->desc;
  iVar8 = this->CRN;
  iVar9 = this->FRN;
  iVar1 = this->begin;
  iVar5 = this->end;
  local_78._M_dataplus._M_p = (pointer)accessor;
  local_78._M_string_length = (size_type)accessor;
  local_78.field_2._M_local_buf[0] = bVar3;
  if (iVar8 == iVar9) {
    if (iVar8 != iVar5 && iVar1 != iVar5) {
      uVar4 = (long)(iVar5 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp._M_comp.desc = bVar3;
      __comp._M_comp.accessor_r = accessor;
      __comp._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>>>
                (v_t + iVar1,v_t + iVar8,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,__comp
                );
      iVar8 = this->FRN;
    }
    RVar10 = QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
             ::operator()(accessor,v_t + iVar8);
    input.lower = RVar10.upper;
    iVar7 = 0;
    bVar3 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(RVar10,&local_58,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input.upper = iVar7;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>(&local_78,(duckdb *)RVar10.lower,input)
      ;
      duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_78);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    hVar11.upper = local_58.upper;
    hVar11.lower = local_58.lower;
  }
  else {
    if (iVar9 != iVar5 && iVar1 != iVar5) {
      uVar4 = (long)(iVar5 * 8 + iVar1 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_00._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_00._M_comp.desc = bVar3;
      __comp_00._M_comp.accessor_r = accessor;
      __comp_00._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>>>
                (v_t + iVar1,v_t + iVar9,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_00);
      iVar9 = this->FRN;
      iVar8 = this->CRN;
      iVar5 = this->end;
    }
    local_78._M_dataplus._M_p = (pointer)accessor;
    local_78._M_string_length = (size_type)accessor;
    local_78.field_2._M_local_buf[0] = bVar3;
    if (iVar8 != iVar5 && iVar9 != iVar5) {
      uVar4 = (long)(iVar5 * 8 + iVar9 * -8) >> 3;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      __comp_01._M_comp._17_7_ = local_78.field_2._M_allocated_capacity._1_7_;
      __comp_01._M_comp.desc = bVar3;
      __comp_01._M_comp.accessor_r = accessor;
      __comp_01._M_comp.accessor_l = accessor;
      std::
      __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<duckdb::QuantileCompare<duckdb::QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>,duckdb::QuantileIndirect<duckdb::hugeint_t>>>>>
                (v_t + iVar9,v_t + iVar8,v_t + iVar5,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 __comp_01);
      iVar9 = this->FRN;
    }
    RVar10 = QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
             ::operator()(accessor,v_t + iVar9);
    input_00.lower = RVar10.upper;
    iVar7 = 0;
    bVar3 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(RVar10,&local_58,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_00.upper = iVar7;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                (&local_78,(duckdb *)RVar10.lower,input_00);
      duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_78);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_48.lower = local_58.lower;
    local_48.upper = local_58.upper;
    RVar10 = QuantileComposed<duckdb::MadAccessor<duckdb::hugeint_t,_duckdb::hugeint_t,_duckdb::hugeint_t>,_duckdb::QuantileIndirect<duckdb::hugeint_t>_>
             ::operator()(accessor,v_t + this->CRN);
    input_01.lower = RVar10.upper;
    iVar7 = 0;
    bVar3 = duckdb::TryCast::Operation<duckdb::hugeint_t,duckdb::hugeint_t>(RVar10,&local_58,false);
    if (!bVar3) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      input_01.upper = iVar7;
      CastExceptionText<duckdb::hugeint_t,duckdb::hugeint_t>
                (&local_78,(duckdb *)RVar10.lower,input_01);
      duckdb::InvalidInputException::InvalidInputException(pIVar6,(string *)&local_78);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,std::runtime_error::~runtime_error);
    }
    local_78._M_dataplus._M_p = (pointer)local_58.lower;
    local_78._M_string_length = local_58.upper;
    hVar11 = CastInterpolation::Interpolate<duckdb::hugeint_t>
                       (&local_48,
                        this->RN -
                        (((double)CONCAT44(0x45300000,(int)(this->FRN >> 0x20)) -
                         1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)this->FRN) - 4503599627370496.0)),
                        (hugeint_t *)&local_78);
  }
  return hVar11;
}

Assistant:

TARGET_TYPE Operation(INPUT_TYPE *v_t, Vector &result, const ACCESSOR &accessor = ACCESSOR()) const {
		using ACCESS_TYPE = typename ACCESSOR::RESULT_TYPE;
		QuantileCompare<ACCESSOR> comp(accessor, desc);
		if (CRN == FRN) {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			return CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
		} else {
			std::nth_element(v_t + begin, v_t + FRN, v_t + end, comp);
			std::nth_element(v_t + FRN, v_t + CRN, v_t + end, comp);
			auto lo = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[FRN]), result);
			auto hi = CastInterpolation::Cast<ACCESS_TYPE, TARGET_TYPE>(accessor(v_t[CRN]), result);
			return CastInterpolation::Interpolate<TARGET_TYPE>(lo, RN - FRN, hi);
		}
	}